

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileMonitor.cxx
# Opt level: O2

void __thiscall cmRealDirectoryWatcher::~cmRealDirectoryWatcher(cmRealDirectoryWatcher *this)

{
  (this->super_cmVirtualDirectoryWatcher).super_cmIBaseWatcher._vptr_cmIBaseWatcher =
       (_func_int **)&PTR__cmRealDirectoryWatcher_0064ffd0;
  std::__cxx11::string::~string((string *)&this->PathSegment);
  cmVirtualDirectoryWatcher::~cmVirtualDirectoryWatcher(&this->super_cmVirtualDirectoryWatcher);
  return;
}

Assistant:

~cmRealDirectoryWatcher() override
  {
    // Handle is freed via uv_handle_close callback!
  }